

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O1

uint32_t u8_nextchar(char *s,int *i)

{
  int iVar1;
  
  iVar1 = *i;
  *i = iVar1 + 1;
  return (uint)(byte)s[iVar1];
}

Assistant:

uint32_t u8_nextchar(const char *s, int *i)
{
    uint32_t ch = 0;
    int sz = 0;

    do {
        ch <<= 6;
        ch += (unsigned char)s[(*i)++];
        sz++;
    } while (s[*i] && !isutf(s[*i]));
    ch -= offsetsFromUTF8[sz-1];

    return ch;
}